

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryPropertyDescriptor.h
# Opt level: O1

void __thiscall
Js::DictionaryPropertyDescriptor<int>::AddShadowedData
          (DictionaryPropertyDescriptor<int> *this,int *nextPropertyIndex,bool addingLetConstGlobal)

{
  Flags FVar1;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  undefined4 *puVar5;
  
  if ((this->flags & IsShadowed) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0xef,"(!GetIsShadowed())","!GetIsShadowed()");
    if (!bVar3) goto LAB_00db80b9;
    *puVar5 = 0;
  }
  FVar1 = this->flags;
  this->flags = FVar1 | IsShadowed;
  if ((FVar1 & IsAccessor) == None) {
    if (addingLetConstGlobal) {
      this->Getter = this->Data;
LAB_00db8014:
      iVar4 = *nextPropertyIndex;
      if (SCARRY4(iVar4,1)) {
LAB_00db80bb:
        ::Math::DefaultOverflowPolicy();
      }
      *nextPropertyIndex = iVar4 + 1;
      this->Data = iVar4;
    }
    else {
      iVar4 = *nextPropertyIndex;
      if (SCARRY4(iVar4,1)) goto LAB_00db80bb;
      *nextPropertyIndex = iVar4 + 1;
      this->Getter = iVar4;
    }
    this->Attributes = this->Attributes | 0x10;
    if (!addingLetConstGlobal) goto LAB_00db8053;
    iVar4 = GetDataPropertyIndex<true>(this);
  }
  else {
    if (this->Data != -1) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                  ,0xf3,"(this->Data == NoSlots)","this->Data == NoSlots");
      if (!bVar3) goto LAB_00db80b9;
      *puVar5 = 0;
    }
    if (addingLetConstGlobal) goto LAB_00db8014;
    this->Attributes = this->Attributes | 0x10;
LAB_00db8053:
    iVar4 = GetDataPropertyIndex<false>(this);
  }
  if (iVar4 == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/DictionaryPropertyDescriptor.h"
                                ,0x103,
                                "((addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots)"
                                ,
                                "(addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots"
                               );
    if (!bVar3) {
LAB_00db80b9:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return;
}

Assistant:

void DictionaryPropertyDescriptor<TPropertyIndex>::AddShadowedData(TPropertyIndex& nextPropertyIndex, bool addingLetConstGlobal)
    {
        Assert(!GetIsShadowed());
        SetIsShadowed(true);
        if (GetIsAccessor())
        {
            Assert(this->Data == NoSlots);
            if (addingLetConstGlobal)
            {
                this->Data = ::Math::PostInc(nextPropertyIndex);
            }
        }
        else if (addingLetConstGlobal)
        {
            this->Getter = this->Data;
            this->Data = ::Math::PostInc(nextPropertyIndex);
        }
        else
        {
            this->Getter = ::Math::PostInc(nextPropertyIndex);
        }
        this->Attributes |= PropertyLetConstGlobal;
        Assert((addingLetConstGlobal ? GetDataPropertyIndex<true>() : GetDataPropertyIndex<false>()) != NoSlots);
    }